

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

void __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicType *type,CachedData *data,
          BigPropertyIndex initialPropertyCount)

{
  BigPropertyIndex initialPropertyCount_local;
  CachedData *data_local;
  DynamicType *type_local;
  DynamicObjectPropertyEnumerator *this_local;
  
  Memory::WriteBarrierPtr<Js::DynamicType>::operator=(&this->initialType,type);
  Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator=
            (&this->cachedData,data);
  this->initialPropertyCount = initialPropertyCount;
  return;
}

Assistant:

void DynamicObjectPropertyEnumerator::Initialize(DynamicType * type, CachedData * data, Js::BigPropertyIndex initialPropertyCount)
    {
        this->initialType = type;
        this->cachedData = data;
        this->initialPropertyCount = initialPropertyCount;
    }